

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

void __thiscall branch_and_reduce_algorithm::get_stcut_vertices(branch_and_reduce_algorithm *this)

{
  vector<int,_std::allocator<int>_> *partition_index;
  vector<int,std::allocator<int>> *pvVar1;
  pointer piVar2;
  iterator iVar3;
  int *piVar4;
  pointer ppVar5;
  int iVar6;
  int iVar7;
  pointer piVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  pointer ppVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int u;
  int id;
  int v;
  vector<int,_std::allocator<int>_> vc;
  vector<int,_std::allocator<int>_> reverseMapping;
  vector<int,_std::allocator<int>_> U;
  vector<int,_std::allocator<int>_> V;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges;
  vector<int,_std::allocator<int>_> local_1c8;
  vector<int,_std::allocator<int>_> mapping;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  biGraph;
  max_flow_algo flow_algo;
  
  piVar8 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if ((this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar8) {
    (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar8;
  }
  iVar6 = get_max_deg_vtx(this);
  (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar6] = 0;
  iVar7 = get_max_deg_vtx(this);
  (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar6] = -1;
  this->s = iVar6;
  this->t = iVar7;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  max_flow_algo::max_flow_algo(&flow_algo,&this->adj,&this->x);
  partition_index = &this->partition_index;
  piVar2 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar8 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
    *piVar8 = 1;
  }
  max_flow_algo::solve_max_flow_min_cut
            (&flow_algo,this->rn,this->s,this->t,true,&local_1c8,true,&edges,partition_index);
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            (&mapping,(long)this->n,(value_type_conflict1 *)&reverseMapping,(allocator_type *)&U);
  ppVar5 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  id = 0;
  if (edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppVar14 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      u = ppVar14->first;
      v = ppVar14->second;
      if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[u] == -1) {
        mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[u] = id;
        if (reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&reverseMapping,
                     (iterator)
                     reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&u);
        }
        else {
          *reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = u;
          reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&U,
                     (iterator)
                     U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_finish,&id);
        }
        else {
          *U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = id;
          U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + 1;
        }
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&biGraph,&vc);
        if (vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        id = id + 1;
      }
      if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[v] == -1) {
        mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[v] = id;
        if (reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&reverseMapping,
                     (iterator)
                     reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&v);
        }
        else {
          *reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = v;
          reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&V,
                     (iterator)
                     V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_finish,&id);
        }
        else {
          *V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = id;
          V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + 1;
        }
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&biGraph,&vc);
        if (vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        id = id + 1;
      }
      pvVar1 = (vector<int,std::allocator<int>> *)
               (biGraph.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[u]);
      iVar3._M_current = *(int **)(pvVar1 + 8);
      if (iVar3._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar1,iVar3,
                   mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + v);
      }
      else {
        *iVar3._M_current =
             mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[v];
        *(int **)(pvVar1 + 8) = iVar3._M_current + 1;
      }
      pvVar1 = (vector<int,std::allocator<int>> *)
               (biGraph.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[v]);
      iVar3._M_current = *(int **)(pvVar1 + 8);
      if (iVar3._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar1,iVar3,
                   mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + u);
      }
      else {
        *iVar3._M_current =
             mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[u];
        *(int **)(pvVar1 + 8) = iVar3._M_current + 1;
      }
      ppVar14 = ppVar14 + 1;
    } while (ppVar14 != ppVar5);
  }
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  hc_karp(&biGraph,&U,&V,&vc);
  if ((long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    lVar11 = (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start >> 2;
    piVar8 = (partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      iVar6 = reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar13]];
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar13] = iVar6;
      piVar8[iVar6] = 2;
      lVar13 = lVar13 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
  }
  u = 0;
  if ((this->adj).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->adj).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar9] < 0) &&
         ((partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar9] == 2)) {
        iVar3._M_current =
             (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->cut,iVar3,&u);
        }
        else {
          *iVar3._M_current = (int)uVar9;
          (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar3._M_current + 1;
        }
      }
      uVar9 = (long)u + 1;
      u = (int)uVar9;
      uVar12 = ((long)(this->adj).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->adj).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar9 <= uVar12 && uVar12 - uVar9 != 0);
  }
  piVar10 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar4 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar10 == piVar4) {
    dVar15 = 0.0;
  }
  else {
    lVar11 = 0;
    do {
      lVar11 = lVar11 + (ulong)(*piVar10 == -1);
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar4);
    auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar16._0_8_ = lVar11;
    auVar16._12_4_ = 0x45300000;
    dVar15 = (auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  }
  uVar9 = TUNING_PARAM1;
  if (TUNING_PARAM1 < 0) {
    uVar9 = (ulong)(uint)(int)((double)this->rn * ((double)-TUNING_PARAM1 / 100.0));
  }
  piVar8 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if ((uVar9 & 0xffffffff) < (ulong)((long)piVar2 - (long)piVar8 >> 2)) {
    if (piVar2 == piVar8) goto LAB_0011484d;
  }
  else if ((piVar2 == piVar8) ||
          (lVar11 = (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2,
          auVar17._8_4_ =
               (int)((long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 0x22), auVar17._0_8_ = lVar11,
          auVar17._12_4_ = 0x45300000,
          dVar15 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / dVar15,
          TUNING_PARAM2 <= dVar15 && dVar15 <= 1.0 - TUNING_PARAM2)) goto LAB_0011484d;
  (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar8;
LAB_0011484d:
  if (vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start,
                    (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&biGraph);
  if (V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  max_flow_algo::~max_flow_algo(&flow_algo);
  if (edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(edges.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)edges.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)edges.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::get_stcut_vertices()
{
    cut.clear();
    // choose s and t with max deg
    NodeID v1 = get_max_deg_vtx();
    x[v1] = 0;
    NodeID v2 = get_max_deg_vtx();
    x[v1] = -1;

    s = v1;
    t = v2;

    std::vector<int> res = {};
    std::vector<std::pair<int, int>> edges;

    max_flow_algo flow_algo(adj, x);
    std::fill (partition_index.begin(), partition_index.end(), 1);
    int s2 = flow_algo.solve_max_flow_min_cut(rn, s, t, true, res, true, edges, partition_index);

    std::vector<int> mapping(n, -1);
    std::vector<int> reverseMapping;
    std::vector<int> U, V;
    std::vector<std::vector<int>> biGraph;

    int id = 0;
    for (auto edge : edges)
    {
        int u = edge.first;
        int v = edge.second;
        if (mapping[u] == -1)
        {
            mapping[u] = id;
            reverseMapping.push_back(u);
            U.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }
        if (mapping[v] == -1)
        {
            mapping[v] = id;
            reverseMapping.push_back(v);
            V.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }

        biGraph[mapping[u]].push_back(mapping[v]);
        biGraph[mapping[v]].push_back(mapping[u]);
    }

    std::vector<int> vc;
    hc_karp(biGraph, U, V, vc);
    for (int i = 0; i < vc.size(); i++)
    {
        vc[i] = reverseMapping[vc[i]];
        partition_index[vc[i]] = 2;
    }

    for (int i = 0; i < adj.size(); ++i)
    {
        if (x[i] < 0 && partition_index[i] == 2)
            cut.push_back(i);
    }

    double perc = (double)res.size() / (double)number_of_nodes_remaining();
    unsigned int max_size = TUNING_PARAM1 >= 0 ? TUNING_PARAM1 : (int)((((double)(-TUNING_PARAM1)) / 100) * (double)rn);
    if (cut.size() > max_size || perc < TUNING_PARAM2 || perc > (1.0 - TUNING_PARAM2))
    {
        // to big, use max. deg. vertex instead
        cut.clear();
    }
}